

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O1

entry * libtorrent::write_resume_data(entry *__return_storage_ptr__,add_torrent_params *atp)

{
  _Rb_tree_header *p_Var1;
  byte *pbVar2;
  _Rb_tree_color _Var3;
  integer_type iVar4;
  unsigned_long uVar5;
  pointer pcVar6;
  size_type sVar7;
  element_type *peVar8;
  pointer __src;
  _Base_ptr p_Var9;
  pointer pbVar10;
  _Head_base<0UL,_unsigned_int_*,_false> _Var11;
  basic_endpoint<boost::asio::ip::tcp> *pbVar12;
  pointer psVar13;
  undefined1 *puVar14;
  uint uVar15;
  string *psVar16;
  entry *peVar17;
  vector<char,std::allocator<char>> *pvVar18;
  string_type *psVar19;
  list_type *plVar20;
  _Base_ptr p_Var21;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this;
  ulong uVar22;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this_00;
  back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_> bVar23;
  uint *puVar24;
  ulong uVar25;
  uint *puVar26;
  basic_endpoint<boost::asio::ip::tcp> *p;
  char *__s;
  basic_endpoint<boost::asio::ip::tcp> *pbVar27;
  uint uVar28;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar29;
  int iVar30;
  long lVar31;
  string *tr;
  pointer __args;
  pointer psVar32;
  bool bVar33;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  string_view key_22;
  span<const_char> v;
  string_view key_23;
  string_view key_24;
  string_view key_25;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  string_view key_30;
  string_view key_31;
  string_view key_32;
  string_view key_33;
  string_view key_34;
  string_view key_35;
  string_view key_36;
  string_view key_37;
  string_view key_38;
  string_view key_39;
  string_view key_40;
  string_view key_41;
  string_view key_42;
  string_view key_43;
  string_view key_44;
  string_view key_45;
  string_view key_46;
  string_view key_47;
  string_view key_48;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ptr6;
  shared_array<char> info;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  undefined1 local_148 [8];
  shared_count sStack_140;
  pointer local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  entry::entry(__return_storage_ptr__);
  key.len_ = 0xb;
  key.ptr_ = "file-format";
  psVar16 = (string *)entry::operator[](__return_storage_ptr__,key);
  entry::destruct((entry *)psVar16);
  *(string **)psVar16 = psVar16 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar16,"libtorrent resume file","");
  psVar16[0x30] = (string)(((byte)psVar16[0x30] & 0x80) + 1);
  key_00.len_ = 0xc;
  key_00.ptr_ = "file-version";
  peVar17 = entry::operator[](__return_storage_ptr__,key_00);
  entry::operator=(peVar17,1);
  key_01.len_ = 0x12;
  key_01.ptr_ = "libtorrent-version";
  psVar16 = (string *)entry::operator[](__return_storage_ptr__,key_01);
  entry::destruct((entry *)psVar16);
  *(string **)psVar16 = psVar16 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar16,"1.2.6.0","");
  psVar16[0x30] = (string)(((byte)psVar16[0x30] & 0x80) + 1);
  __s = "sparse";
  if (atp->storage_mode == storage_mode_allocate) {
    __s = "allocate";
  }
  key_02.len_ = 10;
  key_02.ptr_ = "allocation";
  psVar16 = (string *)entry::operator[](__return_storage_ptr__,key_02);
  entry::destruct((entry *)psVar16);
  std::__cxx11::string::string<std::allocator<char>>(psVar16,__s,(allocator<char> *)local_148);
  psVar16[0x30] = (string)(((byte)psVar16[0x30] & 0x80) + 1);
  iVar4 = atp->total_uploaded;
  key_03.len_ = 0xe;
  key_03.ptr_ = "total_uploaded";
  peVar17 = entry::operator[](__return_storage_ptr__,key_03);
  entry::operator=(peVar17,iVar4);
  iVar4 = atp->total_downloaded;
  key_04.len_ = 0x10;
  key_04.ptr_ = "total_downloaded";
  peVar17 = entry::operator[](__return_storage_ptr__,key_04);
  entry::operator=(peVar17,iVar4);
  iVar30 = atp->active_time;
  key_05.len_ = 0xb;
  key_05.ptr_ = "active_time";
  peVar17 = entry::operator[](__return_storage_ptr__,key_05);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->finished_time;
  key_06.len_ = 0xd;
  key_06.ptr_ = "finished_time";
  peVar17 = entry::operator[](__return_storage_ptr__,key_06);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->seeding_time;
  key_07.len_ = 0xc;
  key_07.ptr_ = "seeding_time";
  peVar17 = entry::operator[](__return_storage_ptr__,key_07);
  entry::operator=(peVar17,(long)iVar30);
  iVar4 = atp->last_seen_complete;
  key_08.len_ = 0x12;
  key_08.ptr_ = "last_seen_complete";
  peVar17 = entry::operator[](__return_storage_ptr__,key_08);
  entry::operator=(peVar17,iVar4);
  iVar4 = atp->last_download;
  key_09.len_ = 0xd;
  key_09.ptr_ = "last_download";
  peVar17 = entry::operator[](__return_storage_ptr__,key_09);
  entry::operator=(peVar17,iVar4);
  iVar4 = atp->last_upload;
  key_10.len_ = 0xb;
  key_10.ptr_ = "last_upload";
  peVar17 = entry::operator[](__return_storage_ptr__,key_10);
  entry::operator=(peVar17,iVar4);
  iVar30 = atp->num_complete;
  key_11.len_ = 0xc;
  key_11.ptr_ = "num_complete";
  peVar17 = entry::operator[](__return_storage_ptr__,key_11);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->num_incomplete;
  key_12.len_ = 0xe;
  key_12.ptr_ = "num_incomplete";
  peVar17 = entry::operator[](__return_storage_ptr__,key_12);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->num_downloaded;
  key_13.len_ = 0xe;
  key_13.ptr_ = "num_downloaded";
  peVar17 = entry::operator[](__return_storage_ptr__,key_13);
  entry::operator=(peVar17,(long)iVar30);
  uVar25 = (atp->flags).m_val;
  key_14.len_ = 0x13;
  key_14.ptr_ = "sequential_download";
  peVar17 = entry::operator[](__return_storage_ptr__,key_14);
  entry::operator=(peVar17,(ulong)((uint)(uVar25 >> 9) & 1));
  uVar5 = (atp->flags).m_val;
  key_15.len_ = 9;
  key_15.ptr_ = "seed_mode";
  peVar17 = entry::operator[](__return_storage_ptr__,key_15);
  entry::operator=(peVar17,(ulong)((uint)uVar5 & 1));
  uVar5 = (atp->flags).m_val;
  key_16.len_ = 0xd;
  key_16.ptr_ = "super_seeding";
  peVar17 = entry::operator[](__return_storage_ptr__,key_16);
  entry::operator=(peVar17,(ulong)((uint)(uVar5 >> 8) & 1));
  iVar4 = atp->added_time;
  key_17.len_ = 10;
  key_17.ptr_ = "added_time";
  peVar17 = entry::operator[](__return_storage_ptr__,key_17);
  entry::operator=(peVar17,iVar4);
  iVar4 = atp->completed_time;
  key_18.len_ = 0xe;
  key_18.ptr_ = "completed_time";
  peVar17 = entry::operator[](__return_storage_ptr__,key_18);
  entry::operator=(peVar17,iVar4);
  pcVar6 = (atp->save_path)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar6,pcVar6 + (atp->save_path)._M_string_length);
  key_19.len_ = 9;
  key_19.ptr_ = "save_path";
  peVar17 = entry::operator[](__return_storage_ptr__,key_19);
  entry::operator=(peVar17,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  sVar7 = (atp->url)._M_string_length;
  if (sVar7 != 0) {
    pcVar6 = (atp->url)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar6,pcVar6 + sVar7);
    key_20.len_ = 3;
    key_20.ptr_ = "url";
    peVar17 = entry::operator[](__return_storage_ptr__,key_20);
    entry::operator=(peVar17,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  sVar7 = (atp->uuid)._M_string_length;
  if (sVar7 != 0) {
    pcVar6 = (atp->uuid)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar6,pcVar6 + sVar7);
    key_21.len_ = 4;
    key_21.ptr_ = "uuid";
    peVar17 = entry::operator[](__return_storage_ptr__,key_21);
    entry::operator=(peVar17,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  key_22.len_ = 9;
  key_22.ptr_ = "info-hash";
  peVar17 = entry::operator[](__return_storage_ptr__,key_22);
  v.m_len = 0x14;
  v.m_ptr = (char *)&atp->info_hash;
  entry::operator=(peVar17,v);
  peVar8 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar8 != (element_type *)0x0) {
    local_148 = (undefined1  [8])(peVar8->m_info_section).px;
    sStack_140.pi_ = (peVar8->m_info_section).pn.pi_;
    if (sStack_140.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (sStack_140.pi_)->use_count_ = (sStack_140.pi_)->use_count_ + 1;
      UNLOCK();
    }
    iVar30 = ((atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_info_section_size;
    key_23.len_ = 4;
    key_23.ptr_ = "info";
    peVar17 = entry::operator[](__return_storage_ptr__,key_23);
    pvVar18 = (vector<char,std::allocator<char>> *)entry::preformatted(peVar17);
    if (local_148 == (undefined1  [8])0x0) {
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_array.hpp",199,
                    "T &boost::shared_array<char>::operator[](std::ptrdiff_t) const [T = char]");
    }
    std::vector<char,std::allocator<char>>::_M_assign_aux<char*>
              (pvVar18,local_148,(long)&((_Alloc_hider *)local_148)->_M_p + (long)iVar30);
    peVar8 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    sVar7 = (peVar8->m_comment)._M_string_length;
    if (sVar7 != 0) {
      pcVar6 = (peVar8->m_comment)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar6,pcVar6 + sVar7);
      key_24.len_ = 7;
      key_24.ptr_ = "comment";
      peVar17 = entry::operator[](__return_storage_ptr__,key_24);
      entry::operator=(peVar17,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    lVar31 = ((atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_creation_date;
    if (lVar31 != 0) {
      key_25.len_ = 0xd;
      key_25.ptr_ = "creation date";
      peVar17 = entry::operator[](__return_storage_ptr__,key_25);
      entry::operator=(peVar17,lVar31);
    }
    peVar8 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    sVar7 = (peVar8->m_created_by)._M_string_length;
    if (sVar7 != 0) {
      pcVar6 = (peVar8->m_created_by)._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar6,pcVar6 + sVar7);
      key_26.len_ = 10;
      key_26.ptr_ = "created by";
      peVar17 = entry::operator[](__return_storage_ptr__,key_26);
      entry::operator=(peVar17,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    boost::detail::shared_count::~shared_count(&sStack_140);
  }
  if ((atp->merkle_tree).
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (atp->merkle_tree).
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    key_27.len_ = 0xb;
    key_27.ptr_ = "merkle tree";
    peVar17 = entry::operator[](__return_storage_ptr__,key_27);
    psVar19 = entry::string_abi_cxx11_(peVar17);
    std::__cxx11::string::resize
              ((ulong)psVar19,
               (char)(atp->merkle_tree).
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (char)(atp->merkle_tree).
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    __src = (atp->merkle_tree).
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    memcpy((psVar19->_M_dataplus)._M_p,__src,
           (long)(atp->merkle_tree).
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
  }
  if ((atp->unfinished_pieces).
      super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    key_28.len_ = 10;
    key_28.ptr_ = "unfinished";
    peVar17 = entry::operator[](__return_storage_ptr__,key_28);
    plVar20 = entry::list(peVar17);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (plVar20,(atp->unfinished_pieces).
                       super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var21 = (atp->unfinished_pieces).
              super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(atp->unfinished_pieces).
              super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 != p_Var1) {
      do {
        entry::entry((entry *)local_148,dictionary_t);
        _Var3 = p_Var21[1]._M_color;
        key_29.len_ = 5;
        key_29.ptr_ = "piece";
        peVar17 = entry::operator[]((entry *)local_148,key_29);
        entry::operator=(peVar17,(long)(int)_Var3);
        p_Var9 = p_Var21[1]._M_parent;
        puVar14 = &p_Var9->field_0x4;
        if (p_Var9 == (_Base_ptr)0x0) {
          uVar25 = 0;
          puVar14 = (undefined1 *)0x0;
        }
        else {
          uVar25 = (long)(int)p_Var9->_M_color + 7U >> 3;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,puVar14,puVar14 + uVar25);
        key_30.len_ = 7;
        key_30.ptr_ = "bitmask";
        peVar17 = entry::operator[]((entry *)local_148,key_30);
        entry::operator=(peVar17,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
        emplace_back<libtorrent::entry>(plVar20,(entry *)local_148);
        entry::~entry((entry *)local_148);
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var1);
    }
  }
  key_31.len_ = 8;
  key_31.ptr_ = "trackers";
  peVar17 = entry::operator[](__return_storage_ptr__,key_31);
  this = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar17);
  if ((atp->trackers).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->trackers).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_148 = (undefined1  [8])0x0;
    sStack_140.pi_ = (sp_counted_base *)0x0;
    local_138 = (pointer)0x0;
    std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              (this,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_148);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_148);
    __args = (atp->trackers).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (atp->trackers).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__args != pbVar10) {
      puVar24 = (uint *)(atp->tracker_tiers).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      uVar25 = 0;
      do {
        if (puVar24 !=
            (uint *)(atp->tracker_tiers).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish) {
          uVar28 = *puVar24;
          puVar24 = puVar24 + 1;
          uVar25 = (ulong)uVar28;
          if (0x3ff < uVar28) {
            uVar25 = 0x400;
          }
        }
        uVar22 = (*(long *)(this + 8) - *(long *)this >> 3) * 0x6db6db6db6db6db7;
        if (uVar22 < uVar25 || uVar22 - uVar25 == 0) {
          std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                    ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)this,
                     uVar25 + 1);
        }
        this_00 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list((entry *)(uVar25 * 0x38 + *(long *)this));
        std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(this_00,__args);
        __args = __args + 1;
      } while (__args != pbVar10);
    }
  }
  key_32.len_ = 8;
  key_32.ptr_ = "url-list";
  peVar17 = entry::operator[](__return_storage_ptr__,key_32);
  bVar23.container = entry::list(peVar17);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
            ((atp->url_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (atp->url_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,bVar23);
  key_33.len_ = 9;
  key_33.ptr_ = "httpseeds";
  peVar17 = entry::operator[](__return_storage_ptr__,key_33);
  bVar23.container = entry::list(peVar17);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
            ((atp->http_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (atp->http_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,bVar23);
  key_34.len_ = 6;
  key_34.ptr_ = "pieces";
  peVar17 = entry::operator[](__return_storage_ptr__,key_34);
  psVar19 = entry::string_abi_cxx11_(peVar17);
  _Var11._M_head_impl =
       *(uint **)&(atp->have_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  uVar15 = 0;
  uVar28 = 0;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var11._M_head_impl !=
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    uVar28 = *_Var11._M_head_impl;
  }
  _Var11._M_head_impl =
       *(uint **)&(atp->verified_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var11._M_head_impl !=
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    uVar15 = *_Var11._M_head_impl;
  }
  if ((int)uVar15 < (int)uVar28) {
    uVar15 = uVar28;
  }
  std::__cxx11::string::resize((ulong)psVar19,(char)uVar15);
  _Var11._M_head_impl =
       *(uint **)&(atp->have_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  puVar24 = _Var11._M_head_impl + 1;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var11._M_head_impl ==
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    puVar26 = (uint *)0x0;
    uVar28 = 0x80000000;
    puVar24 = (uint *)0x0;
  }
  else {
    uVar28 = *_Var11._M_head_impl;
    iVar30 = uVar28 + 0x3e;
    if (-1 < (int)(uVar28 + 0x1f)) {
      iVar30 = uVar28 + 0x1f;
    }
    puVar26 = puVar24 + ((long)(iVar30 >> 5) - (ulong)((uVar28 & 0x1f) != 0));
    uVar28 = 0x80000000 >> (sbyte)(uVar28 & 0x1f);
  }
  lVar31 = 0;
  uVar15 = 0x80000000;
  do {
    (psVar19->_M_dataplus)._M_p[lVar31] =
         (*puVar24 &
         (uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18)) != 0
    ;
    lVar31 = lVar31 + 1;
    bVar33 = uVar15 == 1;
    puVar24 = puVar24 + bVar33;
    uVar15 = uVar15 >> 1;
    if (bVar33) {
      uVar15 = 0x80000000;
    }
  } while ((puVar24 != puVar26) || (uVar15 != uVar28));
  _Var11._M_head_impl =
       *(uint **)&(atp->verified_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  puVar24 = _Var11._M_head_impl + 1;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var11._M_head_impl ==
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    puVar26 = (uint *)0x0;
    uVar28 = 0x80000000;
    puVar24 = (uint *)0x0;
  }
  else {
    uVar28 = *_Var11._M_head_impl;
    iVar30 = uVar28 + 0x3e;
    if (-1 < (int)(uVar28 + 0x1f)) {
      iVar30 = uVar28 + 0x1f;
    }
    puVar26 = puVar24 + ((long)(iVar30 >> 5) - (ulong)((uVar28 & 0x1f) != 0));
    uVar28 = 0x80000000 >> (sbyte)(uVar28 & 0x1f);
  }
  lVar31 = 0;
  uVar15 = 0x80000000;
  do {
    pbVar2 = (byte *)((psVar19->_M_dataplus)._M_p + lVar31);
    *pbVar2 = *pbVar2 | ((*puVar24 &
                         (uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                         uVar15 << 0x18)) != 0) * '\x02';
    lVar31 = lVar31 + 1;
    bVar33 = uVar15 == 1;
    puVar24 = puVar24 + bVar33;
    uVar15 = uVar15 >> 1;
    if (bVar33) {
      uVar15 = 0x80000000;
    }
  } while ((puVar24 != puVar26) || (uVar15 != uVar28));
  if ((atp->renamed_files).
      super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    key_35.len_ = 0xc;
    key_35.ptr_ = "mapped_files";
    peVar17 = entry::operator[](__return_storage_ptr__,key_35);
    plVar20 = entry::list(peVar17);
    p_Var21 = (atp->renamed_files).
              super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(atp->renamed_files).
              super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 != p_Var1) {
      do {
        uVar22 = (ulong)(int)p_Var21[1]._M_color;
        uVar25 = ((long)(plVar20->
                        super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(plVar20->
                        super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        if (uVar25 < uVar22 || uVar25 - uVar22 == 0) {
          std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                    (plVar20,uVar22 + 1);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,p_Var21[1]._M_parent,
                   (long)&(p_Var21[1]._M_parent)->_M_color + (long)&(p_Var21[1]._M_left)->_M_color);
        entry::operator=((plVar20->
                         super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar22,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var1);
    }
  }
  if ((atp->peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_36.len_ = 5;
    key_36.ptr_ = "peers";
    peVar17 = entry::operator[](__return_storage_ptr__,key_36);
    local_148 = (undefined1  [8])entry::string_abi_cxx11_(peVar17);
    key_37.len_ = 6;
    key_37.ptr_ = "peers6";
    peVar17 = entry::operator[](__return_storage_ptr__,key_37);
    local_150.container = entry::string_abi_cxx11_(peVar17);
    pbVar27 = (atp->peers).
              super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              .
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (atp->peers).
              super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              .
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar27 != pbVar12) {
      do {
        pbVar29 = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_148;
        if ((pbVar27->impl_).data_.base.sa_family != 2) {
          pbVar29 = &local_150;
        }
        detail::
        write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                  (pbVar27,pbVar29);
        pbVar27 = pbVar27 + 1;
      } while (pbVar27 != pbVar12);
    }
  }
  if ((atp->banned_peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->banned_peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_38.len_ = 0xc;
    key_38.ptr_ = "banned_peers";
    peVar17 = entry::operator[](__return_storage_ptr__,key_38);
    local_148 = (undefined1  [8])entry::string_abi_cxx11_(peVar17);
    key_39.len_ = 0xd;
    key_39.ptr_ = "banned_peers6";
    peVar17 = entry::operator[](__return_storage_ptr__,key_39);
    local_150.container = entry::string_abi_cxx11_(peVar17);
    pbVar27 = (atp->banned_peers).
              super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              .
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (atp->banned_peers).
              super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              .
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar27 != pbVar12) {
      do {
        pbVar29 = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_148;
        if ((pbVar27->impl_).data_.base.sa_family != 2) {
          pbVar29 = &local_150;
        }
        detail::
        write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                  (pbVar27,pbVar29);
        pbVar27 = pbVar27 + 1;
      } while (pbVar27 != pbVar12);
    }
  }
  iVar30 = atp->upload_limit;
  key_40.len_ = 0x11;
  key_40.ptr_ = "upload_rate_limit";
  peVar17 = entry::operator[](__return_storage_ptr__,key_40);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->download_limit;
  key_41.len_ = 0x13;
  key_41.ptr_ = "download_rate_limit";
  peVar17 = entry::operator[](__return_storage_ptr__,key_41);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->max_connections;
  key_42.len_ = 0xf;
  key_42.ptr_ = "max_connections";
  peVar17 = entry::operator[](__return_storage_ptr__,key_42);
  entry::operator=(peVar17,(long)iVar30);
  iVar30 = atp->upload_limit;
  key_43.len_ = 0xb;
  key_43.ptr_ = "max_uploads";
  peVar17 = entry::operator[](__return_storage_ptr__,key_43);
  entry::operator=(peVar17,(long)iVar30);
  uVar25 = (atp->flags).m_val;
  key_44.len_ = 6;
  key_44.ptr_ = "paused";
  peVar17 = entry::operator[](__return_storage_ptr__,key_44);
  entry::operator=(peVar17,(ulong)((uint)(uVar25 >> 4) & 1));
  uVar25 = (atp->flags).m_val;
  key_45.len_ = 0xc;
  key_45.ptr_ = "auto_managed";
  peVar17 = entry::operator[](__return_storage_ptr__,key_45);
  entry::operator=(peVar17,(ulong)((uint)(uVar25 >> 5) & 1));
  uVar25 = (atp->flags).m_val;
  key_46.len_ = 0xf;
  key_46.ptr_ = "stop_when_ready";
  peVar17 = entry::operator[](__return_storage_ptr__,key_46);
  entry::operator=(peVar17,(ulong)((uint)(uVar25 >> 10) & 1));
  if ((atp->file_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->file_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_47.len_ = 0xd;
    key_47.ptr_ = "file_priority";
    peVar17 = entry::operator[](__return_storage_ptr__,key_47);
    plVar20 = entry::list(peVar17);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (plVar20,(long)(atp->file_priorities).
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(atp->file_priorities).
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    psVar32 = (atp->file_priorities).
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              .
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar13 = (atp->file_priorities).
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              .
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar32 != psVar13) {
      do {
        local_148[0] = psVar32->m_val;
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
        emplace_back<unsigned_char>(plVar20,local_148);
        psVar32 = psVar32 + 1;
      } while (psVar32 != psVar13);
    }
  }
  if ((atp->piece_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->piece_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_48.len_ = 0xe;
    key_48.ptr_ = "piece_priority";
    peVar17 = entry::operator[](__return_storage_ptr__,key_48);
    psVar19 = entry::string_abi_cxx11_(peVar17);
    std::__cxx11::string::reserve((ulong)psVar19);
    psVar13 = (atp->piece_priorities).
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              .
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar32 = (atp->piece_priorities).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar32 != psVar13;
        psVar32 = psVar32 + 1) {
      std::__cxx11::string::push_back((char)psVar19);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_resume_data(add_torrent_params const& atp)
	{
		entry ret;

		using namespace libtorrent::detail; // for write_*_endpoint()
		ret["file-format"] = "libtorrent resume file";
		ret["file-version"] = 1;
		ret["libtorrent-version"] = LIBTORRENT_VERSION;
		ret["allocation"] = atp.storage_mode == storage_mode_allocate
			? "allocate" : "sparse";

		ret["total_uploaded"] = atp.total_uploaded;
		ret["total_downloaded"] = atp.total_downloaded;

		// cast to seconds in case that internal values doesn't have ratio<1>
		ret["active_time"] = atp.active_time;
		ret["finished_time"] = atp.finished_time;
		ret["seeding_time"] = atp.seeding_time;
		ret["last_seen_complete"] = atp.last_seen_complete;
		ret["last_download"] = atp.last_download;
		ret["last_upload"] = atp.last_upload;

		ret["num_complete"] = atp.num_complete;
		ret["num_incomplete"] = atp.num_incomplete;
		ret["num_downloaded"] = atp.num_downloaded;

		ret["sequential_download"] = bool(atp.flags & torrent_flags::sequential_download);

		ret["seed_mode"] = bool(atp.flags & torrent_flags::seed_mode);
		ret["super_seeding"] = bool(atp.flags & torrent_flags::super_seeding);

		ret["added_time"] = atp.added_time;
		ret["completed_time"] = atp.completed_time;

		ret["save_path"] = atp.save_path;

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		if (!atp.url.empty()) ret["url"] = atp.url;
		if (!atp.uuid.empty()) ret["uuid"] = atp.uuid;
#endif

		ret["info-hash"] = atp.info_hash;

		if (atp.ti)
		{
			auto const info = atp.ti->metadata();
			int const size = atp.ti->metadata_size();
			ret["info"].preformatted().assign(&info[0], &info[0] + size);
			if (!atp.ti->comment().empty())
				ret["comment"] = atp.ti->comment();
			if (atp.ti->creation_date() != 0)
				ret["creation date"] = atp.ti->creation_date();
			if (!atp.ti->creator().empty())
				ret["created by"] = atp.ti->creator();
		}

		if (!atp.merkle_tree.empty())
		{
			// we need to save the whole merkle hash tree
			// in order to resume
			std::string& tree_str = ret["merkle tree"].string();
			auto const& tree = atp.merkle_tree;
			tree_str.resize(tree.size() * 20);
			std::memcpy(&tree_str[0], &tree[0], tree.size() * 20);
		}

		if (!atp.unfinished_pieces.empty())
		{
			entry::list_type& up = ret["unfinished"].list();
			up.reserve(atp.unfinished_pieces.size());

			// info for each unfinished piece
			for (auto const& p : atp.unfinished_pieces)
			{
				entry piece_struct(entry::dictionary_t);

				// the unfinished piece's index
				piece_struct["piece"] = static_cast<int>(p.first);
				piece_struct["bitmask"] = std::string(p.second.data(), std::size_t(p.second.size() + 7) / 8);
				// push the struct onto the unfinished-piece list
				up.push_back(std::move(piece_struct));
			}
		}

		// save trackers
		entry::list_type& tr_list = ret["trackers"].list();
		if (!atp.trackers.empty())
		{
			tr_list.emplace_back(entry::list_type());
			std::size_t tier = 0;
			auto tier_it = atp.tracker_tiers.begin();
			for (std::string const& tr : atp.trackers)
			{
				if (tier_it != atp.tracker_tiers.end())
					tier = aux::clamp(std::size_t(*tier_it++), std::size_t{0}, std::size_t{1024});

				if (tr_list.size() <= tier)
					tr_list.resize(tier + 1);

				tr_list[tier].list().emplace_back(tr);
			}
		}

		// save web seeds
		entry::list_type& url_list = ret["url-list"].list();
		std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));

		entry::list_type& httpseeds_list = ret["httpseeds"].list();
		std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));

		// write have bitmask
		entry::string_type& pieces = ret["pieces"].string();
		pieces.resize(aux::numeric_cast<std::size_t>(std::max(
			atp.have_pieces.size(), atp.verified_pieces.size())));

		std::size_t piece(0);
		for (auto const bit : atp.have_pieces)
		{
			pieces[piece] = bit ? 1 : 0;
			++piece;
		}

		piece = 0;
		for (auto const bit : atp.verified_pieces)
		{
			pieces[piece] |= bit ? 2 : 0;
			++piece;
		}

		// write renamed files
		if (!atp.renamed_files.empty())
		{
			entry::list_type& fl = ret["mapped_files"].list();
			for (auto const& ent : atp.renamed_files)
			{
				std::size_t const idx(static_cast<std::size_t>(static_cast<int>(ent.first)));
				if (idx >= fl.size()) fl.resize(idx + 1);
				fl[idx] = ent.second;
			}
		}

		// write local peers
		if (!atp.peers.empty())
		{
			std::back_insert_iterator<entry::string_type> ptr(ret["peers"].string());
			std::back_insert_iterator<entry::string_type> ptr6(ret["peers6"].string());
			for (auto const& p : atp.peers)
			{
				if (is_v6(p))
					write_endpoint(p, ptr6);
				else
					write_endpoint(p, ptr);
			}
		}

		if (!atp.banned_peers.empty())
		{
			std::back_insert_iterator<entry::string_type> ptr(ret["banned_peers"].string());
			std::back_insert_iterator<entry::string_type> ptr6(ret["banned_peers6"].string());
			for (auto const& p : atp.banned_peers)
			{
				if (is_v6(p))
					write_endpoint(p, ptr6);
				else
					write_endpoint(p, ptr);
			}
		}

		ret["upload_rate_limit"] = atp.upload_limit;
		ret["download_rate_limit"] = atp.download_limit;
		ret["max_connections"] = atp.max_connections;
		ret["max_uploads"] = atp.upload_limit;
		ret["paused"] = bool(atp.flags & torrent_flags::paused);
		ret["auto_managed"] = bool(atp.flags & torrent_flags::auto_managed);
		ret["stop_when_ready"] = bool(atp.flags & torrent_flags::stop_when_ready);

		if (!atp.file_priorities.empty())
		{
			// write file priorities
			entry::list_type& prio = ret["file_priority"].list();
			prio.reserve(atp.file_priorities.size());
			for (auto const p : atp.file_priorities)
				prio.emplace_back(static_cast<std::uint8_t>(p));
		}

		if (!atp.piece_priorities.empty())
		{
			// write piece priorities
			entry::string_type& prio = ret["piece_priority"].string();
			prio.reserve(atp.piece_priorities.size());
			for (auto const p : atp.piece_priorities)
				prio.push_back(static_cast<char>(static_cast<std::uint8_t>(p)));
		}

		return ret;
	}